

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::DeadBranchElimPass::SwitchHasNestedBreak
          (DeadBranchElimPass *this,uint32_t switch_header_id)

{
  bool bVar1;
  uint32_t id;
  BasicBlock *this_00;
  StructuredCFGAnalysis *pSVar2;
  DefUseManager *this_01;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
  block_in_construct;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  block_in_construct.
  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  block_in_construct.
  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  block_in_construct.
  super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = IRContext::get_instr_block((this->super_MemPass).super_Pass.context_,switch_header_id);
  id = BasicBlock::MergeBlockIdIfAny(this_00);
  pSVar2 = IRContext::GetStructuredCFGAnalysis((this->super_MemPass).super_Pass.context_);
  this_01 = Pass::get_def_use_mgr((Pass *)this);
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = ::operator_new(0x18);
  *(DeadBranchElimPass **)local_50._M_unused._0_8_ = this;
  *(StructuredCFGAnalysis **)((long)local_50._M_unused._0_8_ + 8) = pSVar2;
  *(uint32_t *)((long)local_50._M_unused._0_8_ + 0x10) = switch_header_id;
  local_38 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp:636:7)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp:636:7)>
             ::_M_manager;
  bVar1 = analysis::DefUseManager::WhileEachUser
                    (this_01,id,(function<bool_(spvtools::opt::Instruction_*)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  std::_Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
  ~_Vector_base(&block_in_construct.
                 super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
               );
  return !bVar1;
}

Assistant:

bool DeadBranchElimPass::SwitchHasNestedBreak(uint32_t switch_header_id) {
  std::vector<BasicBlock*> block_in_construct;
  BasicBlock* start_block = context()->get_instr_block(switch_header_id);
  uint32_t merge_block_id = start_block->MergeBlockIdIfAny();

  StructuredCFGAnalysis* cfg_analysis = context()->GetStructuredCFGAnalysis();
  return !get_def_use_mgr()->WhileEachUser(
      merge_block_id,
      [this, cfg_analysis, switch_header_id](Instruction* inst) {
        if (!inst->IsBranch()) {
          return true;
        }

        BasicBlock* bb = context()->get_instr_block(inst);
        if (bb->id() == switch_header_id) {
          return true;
        }
        return (cfg_analysis->ContainingConstruct(inst) == switch_header_id &&
                bb->GetMergeInst() == nullptr);
      });
}